

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring.hxx
# Opt level: O3

double * __thiscall Ring<double>::operator[](Ring<double> *this,int *index)

{
  uint uVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  uVar1 = this->ringSize;
  if ((this->ringDelayedAdd != 0.0) || (NAN(this->ringDelayedAdd))) {
    if (0 < (int)uVar1) {
      pdVar2 = this->ringData;
      uVar5 = 0;
      do {
        pdVar2[uVar5] = this->ringDelayedAdd + pdVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    this->ringDelayedAdd = 0.0;
  }
  iVar6 = this->ringCurrentIndex + uVar1 + *index;
  iVar4 = -(*index + this->ringCurrentIndex + uVar1);
  do {
    iVar6 = iVar6 - uVar1;
    iVar4 = iVar4 + uVar1;
  } while ((int)uVar1 <= iVar6);
  iVar3 = 0;
  if (0 < iVar6) {
    iVar3 = iVar6;
  }
  uVar7 = 1;
  if (1 < uVar1) {
    uVar7 = uVar1;
  }
  return this->ringData +
         ((((iVar3 - (uint)(iVar3 != iVar6)) + iVar4) / uVar7 + (uint)(iVar3 != iVar6)) * uVar1 +
         iVar6);
}

Assistant:

void flush() const {
        if (ringDelayedAdd != 0.0) {
            for(int i=0; i<ringSize; i++) {
                ringData[i] += ringDelayedAdd;
            }
            ringDelayedAdd = 0.0;
        }
    }